

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall
ON_Internal_ExtrudedEdge::SetSideGroupIdFromVertexPairs(ON_Internal_ExtrudedEdge *this)

{
  uint uVar1;
  ON_Internal_ExtrudedVertex *pOVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  
  if (this->m_side_group_id == 0) {
    lVar5 = 0;
    bVar3 = true;
    do {
      bVar4 = bVar3;
      if ((this->m_extruded_vertex[lVar5] != (ON_Internal_ExtrudedVertex *)0x0) &&
         (uVar1 = this->m_extruded_vertex[lVar5]->m_side_group_id, uVar1 != 0)) {
        this->m_side_group_id = uVar1;
        lVar5 = 0;
        bVar4 = false;
        bVar3 = true;
        do {
          bVar6 = bVar3;
          pOVar2 = this->m_extruded_vertex[lVar5];
          if ((pOVar2 != (ON_Internal_ExtrudedVertex *)0x0) && (pOVar2->m_side_group_id == 0)) {
            pOVar2->m_side_group_id = uVar1;
            bVar4 = true;
          }
          lVar5 = 1;
          bVar3 = false;
        } while (bVar6);
        return bVar4;
      }
      lVar5 = 1;
      bVar3 = false;
    } while (bVar4);
  }
  return false;
}

Assistant:

bool SetSideGroupIdFromVertexPairs()
  {
    if (m_side_group_id > 0)
      return false;
    for (unsigned evi = 0; evi < 2; ++evi)
    {
      if (nullptr != m_extruded_vertex[evi] && m_extruded_vertex[evi]->m_side_group_id > 0)
        return SetSideGroupId(m_extruded_vertex[evi]->m_side_group_id);
    }
    return false;
  }